

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_string_pad(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int padEnd)

{
  JSValue JVar1;
  JSValue JVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  JSValueUnion JVar6;
  JSValueUnion JVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  JSValue val;
  JSValue v;
  JSValue v_00;
  JSValue JVar11;
  JSValue JVar12;
  StringBuffer b_s;
  uint32_t local_8c;
  int64_t local_88;
  JSValueUnion local_80;
  JSValueUnion local_78;
  JSValueUnion local_70;
  JSValueUnion local_68;
  uint32_t local_60;
  int local_5c;
  JSValueUnion local_58;
  StringBuffer local_50;
  JSValueUnion JVar7;
  
  local_70.float64 = 0.0;
  local_5c = padEnd;
  JVar11 = JS_ToStringCheckObject(ctx,this_val);
  JVar6 = JVar11.u;
  if ((uint)JVar11.tag == 6) goto LAB_0016c07a;
  local_50.ctx = (JSContext *)(argv->u).ptr;
  JVar12 = *argv;
  if (0xfffffff4 < (uint)argv->tag) {
    ((local_50.ctx)->header).ref_count = ((local_50.ctx)->header).ref_count + 1;
  }
  local_58 = JVar6;
  iVar3 = JS_ToInt32SatFree(ctx,(int *)&local_8c,JVar12);
  if (iVar3 == 0) {
    uVar4 = *(uint *)((long)local_58.ptr + 4) & 0x7fffffff;
    uVar10 = local_8c - uVar4;
    if (uVar10 == 0 || (int)local_8c < (int)uVar4) {
LAB_0016c158:
      JVar1.tag = JVar11.tag;
      JVar1.u.ptr = local_58.ptr;
      return JVar1;
    }
    JVar2.tag = 3;
    JVar2.u.ptr = local_70.ptr;
    JVar12.tag = 3;
    JVar12.u.ptr = local_70.ptr;
    uVar5 = 0x20;
    JVar8 = local_58;
    uVar9 = local_8c;
    if ((argc < 2) || (JVar12 = JVar2, (int)argv[1].tag == 3)) {
LAB_0016c0c4:
      JVar7.float64 = 0.0;
    }
    else {
      local_88 = CONCAT44(local_88._4_4_,local_8c);
      local_80.int32 = uVar10;
      local_78.float64 = local_58.float64;
      val.tag = argv[1].tag;
      val.u.ptr = argv[1].u.ptr;
      JVar12 = JS_ToStringInternal(ctx,val,0);
      JVar7 = JVar12.u;
      local_70 = JVar7;
      if ((int)JVar12.tag == 6) goto LAB_0016c04e;
      uVar5 = (uint)*(ulong *)((long)JVar7.ptr + 4);
      JVar8 = local_78;
      uVar9 = (uint32_t)local_88;
      uVar10 = local_80._0_4_;
      if ((uVar5 & 0x7fffffff) == 1) {
        if ((int)uVar5 < 0) {
          uVar5 = (uint)*(ushort *)((long)JVar7.ptr + 0x10);
        }
        else {
          uVar5 = (uint)*(byte *)((long)JVar7.ptr + 0x10);
        }
        goto LAB_0016c0c4;
      }
      if ((*(ulong *)((long)JVar7.ptr + 4) & 0x7fffffff) == 0) {
        JS_FreeValue(ctx,JVar12);
        goto LAB_0016c158;
      }
      uVar5 = 0x20;
    }
    local_70 = JVar12.u;
    if ((int)uVar9 < 0x40000000) {
      local_50.len = 0;
      local_50.is_wide_char = 0;
      local_50.error_status = 0;
      local_88 = JVar12.tag;
      local_80 = JVar7;
      local_78 = JVar8;
      local_60 = uVar4;
      local_50.ctx = ctx;
      local_50.size = uVar9;
      local_50.str = js_alloc_string(ctx,uVar9,0);
      if (local_50.str == (JSString *)0x0) {
        local_50.size = 0;
        local_50.error_status = -1;
      }
      else {
        local_8c = uVar10;
        if ((local_5c == 0) ||
           (iVar3 = string_buffer_concat(&local_50,(JSString *)local_78.ptr,0,local_60),
           uVar9 = local_8c, iVar3 == 0)) {
          uVar9 = local_8c;
          if ((int *)local_80.ptr == (int *)0x0) {
            iVar3 = string_buffer_fill(&local_50,uVar5,uVar10);
            uVar9 = local_8c;
            if (iVar3 == 0) {
LAB_0016c278:
              local_8c = uVar9;
              if ((local_5c != 0) ||
                 (iVar3 = string_buffer_concat(&local_50,(JSString *)local_78.ptr,0,local_60),
                 uVar9 = local_8c, iVar3 == 0)) {
                v.tag = local_88;
                v.u.float64 = local_70.float64;
                JS_FreeValue(ctx,v);
                JVar11.u.float64 = local_58.float64;
                JS_FreeValue(ctx,JVar11);
                JVar11 = string_buffer_end(&local_50);
                return JVar11;
              }
            }
          }
          else {
            do {
              if ((int)uVar9 < 1) goto LAB_0016c278;
              uVar4 = *(uint *)((long)local_80.ptr + 4) & 0x7fffffff;
              uVar10 = uVar9;
              if ((int)uVar4 <= (int)uVar9) {
                uVar10 = uVar4;
              }
              iVar3 = string_buffer_concat(&local_50,(JSString *)local_80.ptr,0,uVar10);
              if (iVar3 != 0) {
                uVar10 = 0;
              }
              uVar9 = uVar9 - uVar10;
            } while (iVar3 == 0);
          }
        }
        local_8c = uVar9;
        (*((local_50.ctx)->rt->mf).js_free)(&(local_50.ctx)->rt->malloc_state,local_50.str);
      }
      local_50.str = (JSString *)0x0;
      local_68.float64 = local_70.float64;
      if ((0xfffffff4 < (uint)local_88) &&
         (iVar3 = *local_70.ptr, *(int *)local_70.ptr = iVar3 + -1, iVar3 < 2)) {
        v_00.tag = local_88;
        v_00.u.ptr = local_70.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
    }
    else {
      JS_ThrowInternalError(ctx,"string too long");
    }
  }
LAB_0016c04e:
  if ((0xfffffff4 < (uint)JVar11.tag) &&
     (iVar3 = *JVar6.ptr, *(int *)JVar6.ptr = iVar3 + -1, iVar3 < 2)) {
    local_68 = JVar6;
    __JS_FreeValueRT(ctx->rt,JVar11);
  }
LAB_0016c07a:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_string_pad(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int padEnd)
{
    JSValue str, v = JS_UNDEFINED;
    StringBuffer b_s, *b = &b_s;
    JSString *p, *p1 = NULL;
    int n, len, c = ' ';

    str = JS_ToStringCheckObject(ctx, this_val);
    if (JS_IsException(str))
        goto fail1;
    if (JS_ToInt32Sat(ctx, &n, argv[0]))
        goto fail2;
    p = JS_VALUE_GET_STRING(str);
    len = p->len;
    if (len >= n)
        return str;
    if (argc > 1 && !JS_IsUndefined(argv[1])) {
        v = JS_ToString(ctx, argv[1]);
        if (JS_IsException(v))
            goto fail2;
        p1 = JS_VALUE_GET_STRING(v);
        if (p1->len == 0) {
            JS_FreeValue(ctx, v);
            return str;
        }
        if (p1->len == 1) {
            c = string_get(p1, 0);
            p1 = NULL;
        }
    }
    if (n > JS_STRING_LEN_MAX) {
        JS_ThrowInternalError(ctx, "string too long");
        goto fail2;
    }
    if (string_buffer_init(ctx, b, n))
        goto fail3;
    n -= len;
    if (padEnd) {
        if (string_buffer_concat(b, p, 0, len))
            goto fail;
    }
    if (p1) {
        while (n > 0) {
            int chunk = min_int(n, p1->len);
            if (string_buffer_concat(b, p1, 0, chunk))
                goto fail;
            n -= chunk;
        }
    } else {
        if (string_buffer_fill(b, c, n))
            goto fail;
    }
    if (!padEnd) {
        if (string_buffer_concat(b, p, 0, len))
            goto fail;
    }
    JS_FreeValue(ctx, v);
    JS_FreeValue(ctx, str);
    return string_buffer_end(b);

fail:
    string_buffer_free(b);
fail3:
    JS_FreeValue(ctx, v);
fail2:
    JS_FreeValue(ctx, str);
fail1:
    return JS_EXCEPTION;
}